

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.h
# Opt level: O0

vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> * __thiscall
phmap::priv::GenerateValuesWithSeed<std::pair<long,long>>
          (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
           *__return_storage_ptr__,priv *this,size_t n,int maxval,int seed)

{
  const_reference pvVar1;
  pair<long,_long> pVar2;
  pair<long,_long> local_68;
  priv *local_58;
  size_t i;
  Generator<std::pair<long,_long>_> local_40;
  Generator<std::pair<long,_long>_> gen;
  vector<int,_std::allocator<int>_> nums;
  int seed_local;
  int maxval_local;
  size_t n_local;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *vec;
  
  GenerateNumbersWithSeed((vector<int,_std::allocator<int>_> *)&gen,(size_t)this,(int)n,maxval);
  Generator<std::pair<long,_long>_>::Generator(&local_40,(int)n);
  i._3_1_ = 0;
  std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::vector
            (__return_storage_ptr__);
  std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::reserve
            (__return_storage_ptr__,(size_type)this);
  for (local_58 = (priv *)0x0; local_58 < this; local_58 = local_58 + 1) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&gen,(size_type)local_58);
    pVar2 = Generator<std::pair<long,_long>_>::operator()(&local_40,*pvVar1);
    local_68 = pVar2;
    std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::push_back
              (__return_storage_ptr__,&local_68);
  }
  i._3_1_ = 1;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&gen);
  return __return_storage_ptr__;
}

Assistant:

std::vector<V> GenerateValuesWithSeed(size_t n, int maxval, int seed) {
        const std::vector<int> nums = GenerateNumbersWithSeed(n, maxval, seed);
        Generator<V> gen(maxval);
        std::vector<V> vec;

        vec.reserve(n);
        for (size_t i = 0; i < n; i++) {
            vec.push_back(gen(nums[i]));
        }

        return vec;
    }